

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O0

void __thiscall
QPDFPageObjectHelper::flattenRotation(QPDFPageObjectHelper *this,QPDFAcroFormDocumentHelper *afdh)

{
  size_t *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  QPDF *pQVar2;
  bool bVar3;
  string *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6b0;
  QPDFObjectHandle local_618;
  allocator<char> local_601;
  string local_600;
  undefined1 local_5e0 [88];
  reference local_588;
  QPDFObjectHandle *f;
  iterator __end2;
  iterator __begin2;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range2;
  shared_ptr<QPDFAcroFormDocumentHelper> local_558;
  undefined1 local_548 [8];
  shared_ptr<QPDFAcroFormDocumentHelper> afdhph;
  set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> old_fields;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_fields;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_annots;
  string local_4d0 [32];
  QPDFObjectHandle annots;
  allocator<char> local_479;
  string local_478;
  undefined1 local_458 [24];
  string local_440 [32];
  undefined1 local_420 [8];
  QPDFObjectHandle rotate_obj;
  string local_408;
  undefined1 local_3e8 [24];
  string local_3d0 [32];
  QPDFObjectHandle local_3b0;
  undefined1 local_3a0 [32];
  undefined1 local_380 [16];
  string local_370;
  allocator<char> local_349;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  undefined1 local_308 [8];
  string cm_str;
  QPDFMatrix cm;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_298;
  double top_y;
  double bottom_y;
  double right_x;
  double left_x;
  Rectangle new_rect;
  Rectangle rect;
  undefined1 local_228 [8];
  QPDFObjectHandle box;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *boxkey;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  iterator local_148;
  size_type local_140;
  undefined1 local_138 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  boxes;
  Rectangle media_rect;
  string local_f8 [32];
  QPDFObjectHandle mediabox;
  int local_b0;
  allocator<char> local_a9;
  int rotate;
  QPDFObjectHandle rotate_oh;
  allocator<char> local_51;
  string local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  QPDF *qpdf;
  QPDFAcroFormDocumentHelper *afdh_local;
  QPDFPageObjectHelper *this_local;
  
  qpdf = (QPDF *)afdh;
  afdh_local = (QPDFAcroFormDocumentHelper *)this;
  QPDFObjectHelper::oh((QPDFObjectHelper *)&stack0xffffffffffffffd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"QPDFPageObjectHelper::flattenRotation called with a direct object"
             ,&local_51);
  psVar4 = (string *)
           QPDFObjectHandle::getQPDF((QPDFObjectHandle *)&stack0xffffffffffffffd0,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffd0);
  local_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar4;
  QPDFObjectHelper::oh((QPDFObjectHelper *)&stack0xffffffffffffff78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&rotate,"/Rotate",&local_a9);
  QPDFObjectHandle::getKey
            ((QPDFObjectHandle *)&stack0xffffffffffffff88,(string *)&stack0xffffffffffffff78);
  std::__cxx11::string::~string((string *)&rotate);
  std::allocator<char>::~allocator(&local_a9);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffff78);
  local_b0 = 0;
  bVar3 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)&stack0xffffffffffffff88);
  if (bVar3) {
    local_b0 = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)&stack0xffffffffffffff88);
  }
  if (((local_b0 == 0x5a) || (local_b0 == 0xb4)) || (local_b0 == 0x10e)) {
    QPDFObjectHelper::oh((QPDFObjectHelper *)&stack0xffffffffffffff28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_f8,"/MediaBox",(allocator<char> *)((long)&media_rect.ury + 7));
    QPDFObjectHandle::getKey
              ((QPDFObjectHandle *)&stack0xffffffffffffff38,(string *)&stack0xffffffffffffff28);
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&media_rect.ury + 7));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffff28);
    bVar3 = QPDFObjectHandle::isRectangle((QPDFObjectHandle *)&stack0xffffffffffffff38);
    if (bVar3) {
      QPDFObjectHandle::getArrayAsRectangle
                ((Rectangle *)
                 &boxes.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (QPDFObjectHandle *)&stack0xffffffffffffff38);
      __range1._2_1_ = 1;
      local_1f0 = &local_1e8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,"/MediaBox",(allocator<char> *)((long)&__range1 + 7));
      local_1f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_1c8,"/CropBox",(allocator<char> *)((long)&__range1 + 6));
      local_1f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_1a8,"/BleedBox",(allocator<char> *)((long)&__range1 + 5));
      local_1f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_188,"/TrimBox",(allocator<char> *)((long)&__range1 + 4));
      local_1f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_168,"/ArtBox",(allocator<char> *)((long)&__range1 + 3));
      __range1._2_1_ = 0;
      local_148 = &local_1e8;
      local_140 = 5;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&__range1 + 1));
      __l._M_len = local_140;
      __l._M_array = local_148;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_138,__l,
               (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&__range1 + 1));
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&__range1 + 1));
      local_6b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148;
      do {
        local_6b0 = local_6b0 + -1;
        std::__cxx11::string::~string((string *)local_6b0);
      } while (local_6b0 != &local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 3));
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 4));
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 5));
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 6));
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_138);
      boxkey = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_138);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&boxkey), bVar3) {
        box.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
        QPDFObjectHelper::oh((QPDFObjectHelper *)&rect.ury);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_228,(string *)&rect.ury);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&rect.ury);
        bVar3 = QPDFObjectHandle::isRectangle((QPDFObjectHandle *)local_228);
        if (bVar3) {
          QPDFObjectHandle::getArrayAsRectangle
                    ((Rectangle *)&new_rect.ury,(QPDFObjectHandle *)local_228);
          QPDFObjectHandle::Rectangle::Rectangle((Rectangle *)&left_x);
          right_x = new_rect.ury -
                    (double)boxes.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
          bottom_y = media_rect.lly - rect.lly;
          top_y = rect.llx - media_rect.llx;
          local_298._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(media_rect.urx - rect.urx);
          if (local_b0 == 0x5a) {
            left_x = media_rect.llx + top_y;
            new_rect.lly = media_rect.urx - (double)local_298._M_pi;
            new_rect.llx = (double)boxes.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + bottom_y;
            new_rect.urx = media_rect.lly - right_x;
          }
          else if (local_b0 == 0xb4) {
            left_x = (double)boxes.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + bottom_y;
            new_rect.lly = media_rect.lly - right_x;
            new_rect.llx = media_rect.llx + (double)local_298._M_pi;
            new_rect.urx = media_rect.urx - top_y;
          }
          else if (local_b0 == 0x10e) {
            left_x = media_rect.llx + (double)local_298._M_pi;
            new_rect.lly = media_rect.urx - top_y;
            new_rect.llx = (double)boxes.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + right_x;
            new_rect.urx = media_rect.lly - bottom_y;
          }
          QPDFObjectHelper::oh((QPDFObjectHelper *)&stack0xfffffffffffffd58);
          _Var1 = box.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          QPDFObjectHandle::newFromRectangle((QPDFObjectHandle *)&cm.f,(Rectangle *)&left_x);
          QPDFObjectHandle::replaceKey
                    ((QPDFObjectHandle *)&stack0xfffffffffffffd58,(string *)_Var1._M_pi,
                     (QPDFObjectHandle *)&cm.f);
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&cm.f);
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xfffffffffffffd58);
          mediabox.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_4_ = 0;
        }
        else {
          mediabox.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_4_ = 3;
        }
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_228);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      QPDFMatrix::QPDFMatrix((QPDFMatrix *)((long)&cm_str.field_2 + 8),0.0,0.0,0.0,0.0,0.0,0.0);
      if (local_b0 == 0x5a) {
        cm.a = -1.0;
        cm.b = 1.0;
        cm.e = media_rect.lly +
               (double)boxes.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      else if (local_b0 == 0xb4) {
        cm_str.field_2._8_8_ = 0xbff0000000000000;
        cm.c = -1.0;
        cm.d = media_rect.lly +
               (double)boxes.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        cm.e = media_rect.urx + media_rect.llx;
      }
      else if (local_b0 == 0x10e) {
        cm.a = 1.0;
        cm.b = -1.0;
        cm.d = media_rect.urx + media_rect.llx;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"q\n",&local_349);
      QPDFMatrix::unparse_abi_cxx11_
                ((string *)(local_380 + 0x10),(QPDFMatrix *)((long)&cm_str.field_2 + 8));
      std::operator+(&local_328,&local_348,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_380 + 0x10));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308,
                     &local_328," cm\n");
      std::__cxx11::string::~string((string *)&local_328);
      std::__cxx11::string::~string((string *)(local_380 + 0x10));
      std::__cxx11::string::~string((string *)&local_348);
      std::allocator<char>::~allocator(&local_349);
      QPDFObjectHelper::oh((QPDFObjectHelper *)local_380);
      QPDFObjectHandle::newStream((QPDF *)(local_3a0 + 0x10),(string *)local_20._M_pi);
      QPDFObjectHandle::addPageContents
                ((QPDFObjectHandle *)local_380,(QPDFObjectHandle *)(local_3a0 + 0x10),true);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_3a0 + 0x10));
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_380);
      QPDFObjectHelper::oh((QPDFObjectHelper *)local_3a0);
      _Var1._M_pi = local_20._M_pi;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_3d0,"\nQ\n",(allocator<char> *)(local_3e8 + 0x17));
      QPDF::newStream((QPDF *)&local_3b0,(string *)_Var1._M_pi);
      QPDFObjectHandle::addPageContents((QPDFObjectHandle *)local_3a0,&local_3b0,false);
      QPDFObjectHandle::~QPDFObjectHandle(&local_3b0);
      std::__cxx11::string::~string(local_3d0);
      std::allocator<char>::~allocator((allocator<char> *)(local_3e8 + 0x17));
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_3a0);
      QPDFObjectHelper::oh((QPDFObjectHelper *)local_3e8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_408,"/Rotate",
                 (allocator<char> *)
                 ((long)&rotate_obj.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      QPDFObjectHandle::removeKey((QPDFObjectHandle *)local_3e8,&local_408);
      std::__cxx11::string::~string((string *)&local_408);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&rotate_obj.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_3e8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_440,"/Rotate",(allocator<char> *)(local_458 + 0x17));
      getAttribute((QPDFPageObjectHelper *)local_420,(string *)this,SUB81(local_440,0));
      std::__cxx11::string::~string(local_440);
      std::allocator<char>::~allocator((allocator<char> *)(local_458 + 0x17));
      bVar3 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_420);
      if (!bVar3) {
        QTC::TC("qpdf","QPDFPageObjectHelper flatten inherit rotate",0);
        QPDFObjectHelper::oh((QPDFObjectHelper *)local_458);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_478,"/Rotate",&local_479);
        QPDFObjectHandle::newInteger
                  ((QPDFObjectHandle *)
                   &annots.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,0);
        QPDFObjectHandle::replaceKey
                  ((QPDFObjectHandle *)local_458,&local_478,
                   (QPDFObjectHandle *)
                   &annots.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        QPDFObjectHandle::~QPDFObjectHandle
                  ((QPDFObjectHandle *)
                   &annots.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__cxx11::string::~string((string *)&local_478);
        std::allocator<char>::~allocator(&local_479);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_458);
      }
      QPDFObjectHelper::oh((QPDFObjectHelper *)&stack0xfffffffffffffb50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_4d0,"/Annots",
                 (allocator<char> *)
                 ((long)&new_annots.
                         super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      QPDFObjectHandle::getKey
                ((QPDFObjectHandle *)&stack0xfffffffffffffb60,(string *)&stack0xfffffffffffffb50);
      std::__cxx11::string::~string(local_4d0);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&new_annots.
                         super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xfffffffffffffb50);
      bVar3 = QPDFObjectHandle::isArray((QPDFObjectHandle *)&stack0xfffffffffffffb60);
      if (bVar3) {
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                   &new_fields.
                    super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                   &old_fields._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::set
                  ((set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
                   &afdhph.
                    super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::shared_ptr<QPDFAcroFormDocumentHelper>::shared_ptr
                  ((shared_ptr<QPDFAcroFormDocumentHelper> *)local_548);
        if (qpdf == (QPDF *)0x0) {
          std::make_shared<QPDFAcroFormDocumentHelper,QPDF&>((QPDF *)&local_558);
          std::shared_ptr<QPDFAcroFormDocumentHelper>::operator=
                    ((shared_ptr<QPDFAcroFormDocumentHelper> *)local_548,&local_558);
          std::shared_ptr<QPDFAcroFormDocumentHelper>::~shared_ptr(&local_558);
          qpdf = (QPDF *)std::__shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>::
                         get((__shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2> *
                             )local_548);
        }
        pQVar2 = qpdf;
        QPDFObjectHandle::QPDFObjectHandle
                  ((QPDFObjectHandle *)&__range2,(QPDFObjectHandle *)&stack0xfffffffffffffb60);
        QPDFAcroFormDocumentHelper::transformAnnotations
                  ((QPDFAcroFormDocumentHelper *)pQVar2,(QPDFObjectHandle *)&__range2,
                   (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                   &new_fields.
                    super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                   &old_fields._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
                   &afdhph.
                    super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(QPDFMatrix *)((long)&cm_str.field_2 + 8),(QPDF *)0x0,
                   (QPDFAcroFormDocumentHelper *)0x0);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__range2);
        QPDFAcroFormDocumentHelper::removeFormFields
                  ((QPDFAcroFormDocumentHelper *)qpdf,
                   (set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
                   &afdhph.
                    super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        this_00 = &old_fields._M_t._M_impl.super__Rb_tree_header._M_node_count;
        __end2 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin
                           ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)this_00);
        f = (QPDFObjectHandle *)
            std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end
                      ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)this_00);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                           *)&f), bVar3) {
          local_588 = __gnu_cxx::
                      __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                      ::operator*(&__end2);
          pQVar2 = qpdf;
          QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)(local_5e0 + 0x10),local_588);
          QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper
                    ((QPDFFormFieldObjectHelper *)(local_5e0 + 0x20),
                     (QPDFObjectHandle *)(local_5e0 + 0x10));
          QPDFAcroFormDocumentHelper::addFormField
                    ((QPDFAcroFormDocumentHelper *)pQVar2,
                     (QPDFFormFieldObjectHelper *)(local_5e0 + 0x20));
          QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper
                    ((QPDFFormFieldObjectHelper *)(local_5e0 + 0x20));
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_5e0 + 0x10));
          __gnu_cxx::
          __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
          ::operator++(&__end2);
        }
        QPDFObjectHelper::oh((QPDFObjectHelper *)local_5e0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_600,"/Annots",&local_601);
        QPDFObjectHandle::newArray
                  (&local_618,
                   (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                   &new_fields.
                    super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        QPDFObjectHandle::replaceKey((QPDFObjectHandle *)local_5e0,&local_600,&local_618);
        QPDFObjectHandle::~QPDFObjectHandle(&local_618);
        std::__cxx11::string::~string((string *)&local_600);
        std::allocator<char>::~allocator(&local_601);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_5e0);
        std::shared_ptr<QPDFAcroFormDocumentHelper>::~shared_ptr
                  ((shared_ptr<QPDFAcroFormDocumentHelper> *)local_548);
        std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::~set
                  ((set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
                   &afdhph.
                    super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                   &old_fields._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                   &new_fields.
                    super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xfffffffffffffb60);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_420);
      std::__cxx11::string::~string((string *)local_308);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_138);
      mediabox.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_4_ = 0;
    }
    else {
      mediabox.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_4_ = 1;
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffff38);
  }
  else {
    mediabox.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ = 1;
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffff88);
  return;
}

Assistant:

void
QPDFPageObjectHelper::flattenRotation(QPDFAcroFormDocumentHelper* afdh)
{
    QPDF& qpdf = oh().getQPDF("QPDFPageObjectHelper::flattenRotation called with a direct object");
    auto rotate_oh = oh().getKey("/Rotate");
    int rotate = 0;
    if (rotate_oh.isInteger()) {
        rotate = rotate_oh.getIntValueAsInt();
    }
    if (!((rotate == 90) || (rotate == 180) || (rotate == 270))) {
        return;
    }
    auto mediabox = oh().getKey("/MediaBox");
    if (!mediabox.isRectangle()) {
        return;
    }
    auto media_rect = mediabox.getArrayAsRectangle();

    std::vector<std::string> boxes = {
        "/MediaBox",
        "/CropBox",
        "/BleedBox",
        "/TrimBox",
        "/ArtBox",
    };
    for (auto const& boxkey: boxes) {
        auto box = oh().getKey(boxkey);
        if (!box.isRectangle()) {
            continue;
        }
        auto rect = box.getArrayAsRectangle();
        decltype(rect) new_rect;

        // How far are the edges of our rectangle from the edges of the media box?
        auto left_x = rect.llx - media_rect.llx;
        auto right_x = media_rect.urx - rect.urx;
        auto bottom_y = rect.lly - media_rect.lly;
        auto top_y = media_rect.ury - rect.ury;

        // Rotating the page 180 degrees does not change /MediaBox. Rotating 90 or 270 degrees
        // reverses llx and lly and also reverse urx and ury. For all the other boxes, we want the
        // corners to be the correct distance away from the corners of the mediabox.
        switch (rotate) {
        case 90:
            new_rect.llx = media_rect.lly + bottom_y;
            new_rect.urx = media_rect.ury - top_y;
            new_rect.lly = media_rect.llx + right_x;
            new_rect.ury = media_rect.urx - left_x;
            break;

        case 180:
            new_rect.llx = media_rect.llx + right_x;
            new_rect.urx = media_rect.urx - left_x;
            new_rect.lly = media_rect.lly + top_y;
            new_rect.ury = media_rect.ury - bottom_y;
            break;

        case 270:
            new_rect.llx = media_rect.lly + top_y;
            new_rect.urx = media_rect.ury - bottom_y;
            new_rect.lly = media_rect.llx + left_x;
            new_rect.ury = media_rect.urx - right_x;
            break;

        default:
            // ignore
            break;
        }

        oh().replaceKey(boxkey, QPDFObjectHandle::newFromRectangle(new_rect));
    }

    // When we rotate the page, pivot about the point 0, 0 and then translate so the page is visible
    // with the origin point being the same offset from the lower left corner of the media box.
    // These calculations have been verified empirically with various
    // PDF readers.
    QPDFMatrix cm(0, 0, 0, 0, 0, 0);
    switch (rotate) {
    case 90:
        cm.b = -1;
        cm.c = 1;
        cm.f = media_rect.urx + media_rect.llx;
        break;

    case 180:
        cm.a = -1;
        cm.d = -1;
        cm.e = media_rect.urx + media_rect.llx;
        cm.f = media_rect.ury + media_rect.lly;
        break;

    case 270:
        cm.b = 1;
        cm.c = -1;
        cm.e = media_rect.ury + media_rect.lly;
        break;

    default:
        break;
    }
    std::string cm_str = std::string("q\n") + cm.unparse() + " cm\n";
    oh().addPageContents(QPDFObjectHandle::newStream(&qpdf, cm_str), true);
    oh().addPageContents(qpdf.newStream("\nQ\n"), false);
    oh().removeKey("/Rotate");
    QPDFObjectHandle rotate_obj = getAttribute("/Rotate", false);
    if (!rotate_obj.isNull()) {
        QTC::TC("qpdf", "QPDFPageObjectHelper flatten inherit rotate");
        oh().replaceKey("/Rotate", QPDFObjectHandle::newInteger(0));
    }

    QPDFObjectHandle annots = oh().getKey("/Annots");
    if (annots.isArray()) {
        std::vector<QPDFObjectHandle> new_annots;
        std::vector<QPDFObjectHandle> new_fields;
        std::set<QPDFObjGen> old_fields;
        std::shared_ptr<QPDFAcroFormDocumentHelper> afdhph;
        if (!afdh) {
            afdhph = std::make_shared<QPDFAcroFormDocumentHelper>(qpdf);
            afdh = afdhph.get();
        }
        afdh->transformAnnotations(annots, new_annots, new_fields, old_fields, cm);
        afdh->removeFormFields(old_fields);
        for (auto const& f: new_fields) {
            afdh->addFormField(QPDFFormFieldObjectHelper(f));
        }
        oh().replaceKey("/Annots", QPDFObjectHandle::newArray(new_annots));
    }
}